

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

void MultARGBRow_SSE2(uint32_t *ptr,int width,int inverse)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar24;
  int width_00;
  undefined1 in_XMM5 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar23 = _DAT_00123b30;
  auVar22 = _DAT_00123b10;
  uVar24 = 0;
  if (inverse == 0) {
    uVar24 = 0;
    while ((long)(uVar24 + 2) <= (long)width) {
      uVar1 = *(ulong *)(ptr + uVar24);
      auVar10._8_6_ = 0;
      auVar10._0_8_ = uVar1;
      auVar10[0xe] = (char)(uVar1 >> 0x38);
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11[0xc] = (char)(uVar1 >> 0x30);
      auVar11._13_2_ = auVar10._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar1;
      auVar12._12_3_ = auVar11._12_3_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = uVar1;
      auVar13[10] = (char)(uVar1 >> 0x28);
      auVar13._11_4_ = auVar12._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar1;
      auVar14._10_5_ = auVar13._10_5_;
      auVar15[8] = (char)(uVar1 >> 0x20);
      auVar15._0_8_ = uVar1;
      auVar15._9_6_ = auVar14._9_6_;
      auVar17._7_8_ = 0;
      auVar17._0_7_ = auVar15._8_7_;
      Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar20._9_6_ = 0;
      auVar20._0_9_ = Var18;
      auVar19._1_10_ = SUB1510(auVar20 << 0x30,5);
      auVar19[0] = (char)(uVar1 >> 0x10);
      auVar21._11_4_ = 0;
      auVar21._0_11_ = auVar19;
      auVar16[2] = (char)(uVar1 >> 8);
      auVar16._0_2_ = (ushort)uVar1;
      auVar16._3_12_ = SUB1512(auVar21 << 0x20,3);
      auVar27._0_2_ = (ushort)uVar1 & 0xff;
      auVar27._2_13_ = auVar16._2_13_;
      auVar27[0xf] = 0;
      auVar25 = pshuflw(in_XMM5,auVar27,0xbf);
      auVar25 = pshufhw(auVar25,auVar25,0xbf);
      auVar25 = auVar25 | auVar22;
      auVar26._0_2_ = auVar25._0_2_ * auVar27._0_2_ + 0x80;
      auVar26._2_2_ = auVar25._2_2_ * auVar16._2_2_ + 0x80;
      auVar26._4_2_ = auVar25._4_2_ * auVar19._0_2_ + 0x80;
      auVar26._6_2_ = auVar25._6_2_ * (short)Var18 + 0x80;
      auVar26._8_2_ = auVar25._8_2_ * auVar15._8_2_ + 0x80;
      auVar26._10_2_ = auVar25._10_2_ * auVar13._10_2_ + 0x80;
      auVar26._12_2_ = auVar25._12_2_ * auVar11._12_2_ + 0x80;
      auVar26._14_2_ = auVar25._14_2_ * (auVar10._13_2_ >> 8) + 0x80;
      auVar27 = pmulhuw(auVar26,auVar23);
      sVar2 = auVar27._0_2_;
      sVar3 = auVar27._2_2_;
      sVar4 = auVar27._4_2_;
      sVar5 = auVar27._6_2_;
      sVar6 = auVar27._8_2_;
      sVar7 = auVar27._10_2_;
      sVar8 = auVar27._12_2_;
      sVar9 = auVar27._14_2_;
      in_XMM5._0_8_ =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar27[0xe] - (0xff < sVar9),
                    CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar27[0xc] - (0xff < sVar8),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar27[10] - (0xff < sVar7),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar27[8] -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar27[6] -
                                                        (0xff < sVar5),
                                                        CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                 auVar27[4] - (0xff < sVar4),
                                                                 CONCAT11((0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar27[2] -
                                                                          (0xff < sVar3),
                                                                          (0 < sVar2) *
                                                                          (sVar2 < 0x100) *
                                                                          auVar27[0] -
                                                                          (0xff < sVar2))))))));
      in_XMM5[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar27[0] - (0xff < sVar2);
      in_XMM5[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar27[2] - (0xff < sVar3);
      in_XMM5[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar27[4] - (0xff < sVar4);
      in_XMM5[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar27[6] - (0xff < sVar5);
      in_XMM5[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar27[8] - (0xff < sVar6);
      in_XMM5[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar27[10] - (0xff < sVar7);
      in_XMM5[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[0xc] - (0xff < sVar8);
      in_XMM5[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[0xe] - (0xff < sVar9);
      *(undefined8 *)(ptr + uVar24) = in_XMM5._0_8_;
      uVar24 = uVar24 + 2;
    }
  }
  width_00 = width - (int)uVar24;
  if (width_00 != 0 && (int)uVar24 <= width) {
    WebPMultARGBRow_C(ptr + (uVar24 & 0xffffffff),width_00,inverse);
    return;
  }
  return;
}

Assistant:

static void MultARGBRow_SSE2(uint32_t* const ptr, int width, int inverse) {
  int x = 0;
  if (!inverse) {
    const int kSpan = 2;
    const __m128i zero = _mm_setzero_si128();
    const __m128i k128 = _mm_set1_epi16(128);
    const __m128i kMult = _mm_set1_epi16(0x0101);
    const __m128i kMask = _mm_set_epi16(0, 0xff, 0, 0, 0, 0xff, 0, 0);
    for (x = 0; x + kSpan <= width; x += kSpan) {
      // To compute 'result = (int)(a * x / 255. + .5)', we use:
      //   tmp = a * v + 128, result = (tmp * 0x0101u) >> 16
      const __m128i A0 = _mm_loadl_epi64((const __m128i*)&ptr[x]);
      const __m128i A1 = _mm_unpacklo_epi8(A0, zero);
      const __m128i A2 = _mm_or_si128(A1, kMask);
      const __m128i A3 = _mm_shufflelo_epi16(A2, _MM_SHUFFLE(2, 3, 3, 3));
      const __m128i A4 = _mm_shufflehi_epi16(A3, _MM_SHUFFLE(2, 3, 3, 3));
      // here, A4 = [ff a0 a0 a0][ff a1 a1 a1]
      const __m128i A5 = _mm_mullo_epi16(A4, A1);
      const __m128i A6 = _mm_add_epi16(A5, k128);
      const __m128i A7 = _mm_mulhi_epu16(A6, kMult);
      const __m128i A10 = _mm_packus_epi16(A7, zero);
      _mm_storel_epi64((__m128i*)&ptr[x], A10);
    }
  }
  width -= x;
  if (width > 0) WebPMultARGBRow_C(ptr + x, width, inverse);
}